

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tikz.cc
# Opt level: O3

bool lf::io::writeTikZ(Mesh *mesh,string *filename,TikzOutputCtrl output_ctrl)

{
  bool bVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::_Function_handler<bool_(const_lf::mesh::Entity_&),_lf::base::PredicateTrue>::
             _M_invoke;
  local_18 = std::_Function_handler<bool_(const_lf::mesh::Entity_&),_lf::base::PredicateTrue>::
             _M_manager;
  bVar1 = writeTikZ(mesh,filename,(function<bool_(const_lf::mesh::Entity_&)> *)&local_28,output_ctrl
                   );
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool writeTikZ(const lf::mesh::Mesh &mesh, const std::string &filename,
               TikzOutputCtrl output_ctrl) {
  return writeTikZ(mesh, filename, base::PredicateTrue{}, output_ctrl);
}